

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O2

void lj_cconv_ct_tv(CTState *cts,CType *d,uint8_t *dp,TValue *o,CTInfo flags)

{
  ushort uVar1;
  uint32_t *puVar2;
  ulong __n;
  uint uVar3;
  TValue *o_00;
  CType *pCVar4;
  void *pvVar5;
  uint uVar6;
  GCtab *pGVar7;
  long lVar8;
  CType *s;
  GCstr *name;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  void *tmpptr;
  ulong local_58;
  ulong local_50;
  GCtab *local_48;
  long local_40;
  CType *local_38;
  
  uVar3 = (o->field_2).it;
  if (uVar3 < 0xfffeffff) {
    flags = flags | 2;
    uVar3 = 0xe;
    goto LAB_0014b6ca;
  }
  switch(uVar3) {
  case 0xfffffff3:
    puVar2 = &(o->u32).lo;
    tmpptr = (void *)((ulong)*puVar2 + 0x18);
    o = (TValue *)&tmpptr;
    uVar3 = 0x11;
    if (*(char *)((ulong)*puVar2 + 6) == '\x01') {
      tmpptr = *tmpptr;
    }
    break;
  case 0xfffffff4:
    uVar3 = d->info >> 0x1c;
    if (uVar3 == 1) {
      uVar3 = (o->u32).lo;
      tmpptr = (void *)((ulong)tmpptr & 0xffffffff00000000);
      memset(dp,0,(ulong)d->size);
      cconv_substruct_tab(cts,d,dp,(GCtab *)(ulong)uVar3,(int32_t *)&tmpptr,flags);
      return;
    }
    if (uVar3 == 3) {
      pGVar7 = (GCtab *)(ulong)(o->u32).lo;
      local_38 = (CType *)((long)&cts->tab->info + (ulong)((d->info & 0xffff) << 4));
      local_50 = (ulong)d->size;
      local_58 = (ulong)local_38->size;
      lVar8 = 0;
      uVar11 = 0;
      uVar9 = 0;
      local_48 = pGVar7;
      do {
        if (uVar11 < pGVar7->asize) {
          o_00 = (TValue *)((ulong)(pGVar7->array).ptr32 + lVar8);
        }
        else {
          local_40 = lVar8;
          o_00 = lj_tab_getinth(local_48,(int32_t)uVar11);
          pGVar7 = local_48;
          lVar8 = local_40;
        }
        __n = local_58;
        uVar3 = (uint)uVar9;
        if ((o_00 == (TValue *)0x0) || ((o_00->field_2).it == 0xffffffff)) {
          if (uVar11 != 0) {
            if ((uint)local_50 == 0xffffffff) {
              return;
            }
            uVar10 = (uint)local_58;
            if (uVar3 == (uint)local_58) {
              uVar9 = local_58 & 0xffffffff;
              while( true ) {
                if ((uint)local_50 <= (uint)uVar9) break;
                memcpy(dp + uVar9,dp,__n);
                uVar9 = (ulong)((uint)uVar9 + uVar10);
              }
              return;
            }
            memset(dp + uVar9,0,(ulong)((uint)local_50 - uVar3));
            return;
          }
        }
        else {
          local_40 = lVar8;
          if ((uint)local_50 <= uVar3) {
            cconv_err_initov(cts,d);
          }
          lj_cconv_ct_tv(cts,local_38,dp + uVar9,o_00,flags);
          uVar9 = (ulong)(uVar3 + (uint)local_58);
          pGVar7 = local_48;
          lVar8 = local_40;
        }
        uVar11 = uVar11 + 1;
        lVar8 = lVar8 + 8;
      } while( true );
    }
LAB_0014baf7:
    cconv_err_convtv(cts,d,o,flags);
  case 0xfffffff5:
    uVar1 = *(ushort *)((ulong)(o->u32).lo + 6);
    uVar3 = (uint)uVar1;
    o = (TValue *)((ulong)(o->u32).lo + 8);
    pCVar4 = cts->tab;
    if ((pCVar4[uVar1].info & 0xf0800000) == 0x20800000) {
      o = *(TValue **)o;
      uVar3 = pCVar4[uVar1].info & 0xffff;
    }
    lVar8 = (ulong)uVar3 * 0x10;
    uVar10 = pCVar4[uVar3].info >> 0x1c;
    if (uVar10 == 5) {
      s = (CType *)((long)&pCVar4->info + (ulong)((pCVar4[uVar3].info & 0xffff) << 4));
      goto LAB_0014b6d6;
    }
    if (uVar10 == 6) {
      uVar3 = lj_ctype_intern(cts,uVar3 | 0x20030000,8);
      d = (CType *)((long)&cts->tab->info + ((long)d - (long)pCVar4 & 0xffffffff0U));
      break;
    }
    goto LAB_0014b6d3;
  default:
    if ((uVar3 & 0xffff8000) != 0xffff0000) {
      if ((uVar3 == 0xfffffff7) &&
         (pvVar5 = lj_ccallback_new(cts,d,(GCfunc *)(ulong)(o->u32).lo), pvVar5 != (void *)0x0)) {
        *(void **)dp = pvVar5;
        return;
      }
      goto LAB_0014baf7;
    }
    tmpptr = (void *)(o->u64 & 0x7fffffffff |
                     (ulong)*(uint *)((ulong)(cts->g->gc).lightudseg.ptr32 +
                                     (o->u64 >> 0x27 & 0xff) * 4) << 0x20);
    goto LAB_0014b8a6;
  case 0xfffffffb:
    name = (GCstr *)(ulong)(o->u32).lo;
    uVar3 = d->info;
    if ((uVar3 & 0xf0000000) == 0x50000000) {
      pCVar4 = lj_ctype_getfieldq(cts,d,name,(CTSize *)&tmpptr,(CTInfo *)0x0);
      if ((pCVar4 == (CType *)0x0) || ((pCVar4->info & 0xf0000000) != 0xb0000000))
      goto LAB_0014baf7;
      o = (TValue *)&pCVar4->size;
      uVar3 = pCVar4->info & 0xffff;
    }
    else {
      if ((uVar3 & 0xfc000000) == 0x30000000) {
        uVar9 = (ulong)((uVar3 & 0xffff) << 4);
        if ((*(uint *)((long)&cts->tab->info + uVar9) < 0x4000000) &&
           (*(int *)((long)&cts->tab->size + uVar9) == 1)) {
          uVar6 = name->len + 1;
          uVar3 = d->size;
          uVar10 = uVar6;
          if (uVar3 < uVar6) {
            uVar10 = uVar3;
          }
          if (uVar3 == 0) {
            uVar10 = uVar6;
          }
          memcpy(dp,name + 1,(ulong)uVar10);
          return;
        }
        goto LAB_0014baf7;
      }
      o = (TValue *)(name + 1);
      flags = flags | 2;
      uVar3 = 0x14;
    }
    break;
  case 0xfffffffd:
  case 0xfffffffe:
    o = (TValue *)&tmpptr;
    tmpptr = (void *)CONCAT71(tmpptr._1_7_,-2 - (char)uVar3);
    uVar3 = 3;
    break;
  case 0xffffffff:
    tmpptr = (void *)0x0;
    flags = flags | 2;
LAB_0014b8a6:
    o = (TValue *)&tmpptr;
    uVar3 = 0x11;
  }
LAB_0014b6ca:
  pCVar4 = cts->tab;
  lVar8 = (ulong)uVar3 << 4;
LAB_0014b6d3:
  s = (CType *)((long)&pCVar4->info + lVar8);
LAB_0014b6d6:
  pCVar4 = (CType *)((long)&pCVar4->info + (ulong)((d->info & 0xffff) << 4));
  if ((d->info & 0xf0000000) != 0x50000000) {
    pCVar4 = d;
  }
  lj_cconv_ct_ct(cts,pCVar4,s,dp,(uint8_t *)&o->u64,flags);
  return;
}

Assistant:

void lj_cconv_ct_tv(CTState *cts, CType *d,
		    uint8_t *dp, TValue *o, CTInfo flags)
{
  CTypeID sid = CTID_P_VOID;
  CType *s;
  void *tmpptr;
  uint8_t tmpbool, *sp = (uint8_t *)&tmpptr;
  if (LJ_LIKELY(tvisint(o))) {
    sp = (uint8_t *)&o->i;
    sid = CTID_INT32;
    flags |= CCF_FROMTV;
  } else if (LJ_LIKELY(tvisnum(o))) {
    sp = (uint8_t *)&o->n;
    sid = CTID_DOUBLE;
    flags |= CCF_FROMTV;
  } else if (tviscdata(o)) {
    sp = cdataptr(cdataV(o));
    sid = cdataV(o)->ctypeid;
    s = ctype_get(cts, sid);
    if (ctype_isref(s->info)) {  /* Resolve reference for value. */
      lj_assertCTS(s->size == CTSIZE_PTR, "ref is not pointer-sized");
      sp = *(void **)sp;
      sid = ctype_cid(s->info);
    }
    s = ctype_raw(cts, sid);
    if (ctype_isfunc(s->info)) {
      CTypeID did = ctype_typeid(cts, d);
      sid = lj_ctype_intern(cts, CTINFO(CT_PTR, CTALIGN_PTR|sid), CTSIZE_PTR);
      d = ctype_get(cts, did);  /* cts->tab may have been reallocated. */
    } else {
      if (ctype_isenum(s->info)) s = ctype_child(cts, s);
      goto doconv;
    }
  } else if (tvisstr(o)) {
    GCstr *str = strV(o);
    if (ctype_isenum(d->info)) {  /* Match string against enum constant. */
      CTSize ofs;
      CType *cct = lj_ctype_getfield(cts, d, str, &ofs);
      if (!cct || !ctype_isconstval(cct->info))
	goto err_conv;
      lj_assertCTS(d->size == 4, "only 32 bit enum supported");  /* NYI */
      sp = (uint8_t *)&cct->size;
      sid = ctype_cid(cct->info);
    } else if (ctype_isrefarray(d->info)) {  /* Copy string to array. */
      CType *dc = ctype_rawchild(cts, d);
      CTSize sz = str->len+1;
      if (!ctype_isinteger(dc->info) || dc->size != 1)
	goto err_conv;
      if (d->size != 0 && d->size < sz)
	sz = d->size;
      memcpy(dp, strdata(str), sz);
      return;
    } else {  /* Otherwise pass it as a const char[]. */
      sp = (uint8_t *)strdata(str);
      sid = CTID_A_CCHAR;
      flags |= CCF_FROMTV;
    }
  } else if (tvistab(o)) {
    if (ctype_isarray(d->info)) {
      cconv_array_tab(cts, d, dp, tabV(o), flags);
      return;
    } else if (ctype_isstruct(d->info)) {
      cconv_struct_tab(cts, d, dp, tabV(o), flags);
      return;
    } else {
      goto err_conv;
    }
  } else if (tvisbool(o)) {
    tmpbool = boolV(o);
    sp = &tmpbool;
    sid = CTID_BOOL;
  } else if (tvisnil(o)) {
    tmpptr = (void *)0;
    flags |= CCF_FROMTV;
  } else if (tvisudata(o)) {
    GCudata *ud = udataV(o);
    tmpptr = uddata(ud);
    if (ud->udtype == UDTYPE_IO_FILE)
      tmpptr = *(void **)tmpptr;
  } else if (tvislightud(o)) {
    tmpptr = lightudV(cts->g, o);
  } else if (tvisfunc(o)) {
    void *p = lj_ccallback_new(cts, d, funcV(o));
    if (p) {
      *(void **)dp = p;
      return;
    }
    goto err_conv;
  } else {
  err_conv:
    cconv_err_convtv(cts, d, o, flags);
  }
  s = ctype_get(cts, sid);
doconv:
  if (ctype_isenum(d->info)) d = ctype_child(cts, d);
  lj_cconv_ct_ct(cts, d, s, dp, sp, flags);
}